

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t sVar1;
  int iVar2;
  char *pcVar3;
  ValidationErrorHandler errorHandler;
  ValidationErrorHandler VStack_28;
  
  if (argc < 2) {
    printHelpText();
    return 0;
  }
  ValidationErrorHandler::ValidationErrorHandler(&VStack_28);
  parse(argv[1],&VStack_28);
  if (VStack_28.mFileNotFound == true) {
    iVar2 = -2;
    printHelpText();
    goto LAB_00647992;
  }
  iVar2 = -1;
  if (VStack_28.mHasHandledSaxParserError != false) goto LAB_00647992;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"",1);
  pcVar3 = argv[1];
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x9e41a8);
  }
  else {
    sVar1 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\" is valid against the COLLADA ",0x1f);
  if (version == COLLADA_14) {
    pcVar3 = "1.4.1";
LAB_00647939:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,5);
  }
  else if (version == COLLADA_15) {
    pcVar3 = "1.5.0";
    goto LAB_00647939;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," schema.",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  iVar2 = 0;
  std::ostream::flush();
LAB_00647992:
  ValidationErrorHandler::~ValidationErrorHandler(&VStack_28);
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) 
{
	if ( argc > 1 ) 
	{
		ValidationErrorHandler errorHandler;

		parse( argv[1], errorHandler);

		if ( errorHandler.getFileNotFound() )
		{
			printHelpText();
			return -2;
		} 
		
		if ( errorHandler.hasHandledSaxParserError() )
		{
			return -1;
		}
		else
		{
			std::cout << "\"" << argv[1]<< "\" is valid against the COLLADA ";
			switch ( version )
			{
			case COLLADASaxFWL::COLLADA_14:
				std::cout << "1.4.1";
				break;
			case COLLADASaxFWL::COLLADA_15:
				std::cout << "1.5.0";
				break;
			}
			std::cout << " schema." << std::endl;
			return 0;
		}
	}
	else
	{
		printHelpText();
		return 0;
	}

}